

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall slang::parsing::Parser::parseCoverageMember(Parser *this)

{
  BumpAllocator *alloc;
  bool bVar1;
  CoverageOptionSyntax *pCVar2;
  NamedLabelSyntax *label;
  DataTypeSyntax *type;
  CoverCrossSyntax *pCVar3;
  CoverpointSyntax *pCVar4;
  SourceLocation location;
  EmptyMemberSyntax *pEVar5;
  uint uVar6;
  AttrList attributes;
  Token TVar7;
  Token TVar8;
  Token local_b0;
  TokenList local_a0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  attributes = parseAttributes(this);
  pCVar2 = parseCoverageOption(this,attributes);
  if (pCVar2 != (CoverageOptionSyntax *)0x0) {
    return &pCVar2->super_MemberSyntax;
  }
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar7.kind == Identifier) &&
     (TVar8 = ParserBase::peek(&this->super_ParserBase,1), TVar8.kind == Colon)) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    label = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar7,TVar8);
    bVar1 = ParserBase::peek(&this->super_ParserBase,CrossKeyword);
    if (bVar1) {
LAB_0068f0f8:
      pCVar3 = parseCoverCross(this,attributes,label);
      return &pCVar3->super_MemberSyntax;
    }
    type = (DataTypeSyntax *)0x0;
  }
  else {
    uVar6 = TVar7._0_4_ & 0xffff;
    bVar1 = slang::syntax::SyntaxFacts::isPossibleDataType(TVar7.kind);
    if (bVar1) {
      type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x1);
      TVar7 = ParserBase::expect(&this->super_ParserBase,Identifier);
      TVar8 = ParserBase::expect(&this->super_ParserBase,Colon);
      label = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar7,TVar8);
    }
    else {
      if (uVar6 == 0x84) {
        label = (NamedLabelSyntax *)0x0;
        goto LAB_0068f0f8;
      }
      if (uVar6 != 0x83) {
        if (attributes._M_extent._M_extent_value._M_extent_value != 0) {
          local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00cb67f8;
          local_a0.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
          local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase.childCount = 0;
          local_a0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
          local_a0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value = 0;
          local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00cbee70;
          alloc = (this->super_ParserBase).alloc;
          local_68.super_SyntaxListBase.childCount =
               attributes._M_extent._M_extent_value._M_extent_value;
          local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> =
               attributes;
          local_b0 = ParserBase::peek(&this->super_ParserBase);
          location = Token::location(&local_b0);
          TVar7 = Token::createMissing(alloc,Semicolon,location);
          pEVar5 = slang::syntax::SyntaxFactory::emptyMember
                             (&this->factory,&local_68,&local_a0,TVar7);
          return &pEVar5->super_MemberSyntax;
        }
        return (MemberSyntax *)0x0;
      }
      type = (DataTypeSyntax *)0x0;
      label = (NamedLabelSyntax *)0x0;
    }
  }
  pCVar4 = parseCoverpoint(this,attributes,type,label);
  return &pCVar4->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseCoverageMember() {
    auto attributes = parseAttributes();

    // check for coverage option
    auto option = parseCoverageOption(attributes);
    if (option)
        return option;

    auto token = peek();
    if (token.kind == TokenKind::Identifier && peek(1).kind == TokenKind::Colon) {
        auto name = consume();
        auto& label = factory.namedLabel(name, consume());
        if (peek(TokenKind::CrossKeyword))
            return parseCoverCross(attributes, &label);
        else
            return parseCoverpoint(attributes, nullptr, &label);
    }

    if (isPossibleDataType(token.kind)) {
        auto& type = parseDataType(TypeOptions::AllowImplicit);
        auto name = expect(TokenKind::Identifier);
        auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
        return parseCoverpoint(attributes, &type, &label);
    }

    switch (token.kind) {
        case TokenKind::CoverPointKeyword:
            return parseCoverpoint(attributes, nullptr, nullptr);
        case TokenKind::CrossKeyword:
            return parseCoverCross(attributes, nullptr);
        default:
            break;
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         peek().location()));
    }

    // otherwise, we got nothing and should just return null so that our caller will skip and try
    // again.
    return nullptr;
}